

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O3

void __thiscall Am_Map_Int2Str::Resize(Am_Map_Int2Str *this,int size)

{
  int iVar1;
  Am_Assoc_Int2Str **__ptr;
  Am_Assoc_Int2Str *pAVar2;
  ulong uVar3;
  int iVar4;
  Am_Assoc_Int2Str **ppAVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  Am_Assoc_Int2Str *pAVar9;
  
  __ptr = this->m_table;
  ppAVar5 = (Am_Assoc_Int2Str **)calloc(1,(long)size * 0x18);
  this->m_table = ppAVar5;
  iVar1 = this->m_size;
  this->m_size = size;
  if (0 < (long)iVar1) {
    iVar7 = this->m_count;
    lVar8 = 0;
    do {
      pAVar9 = __ptr[lVar8];
      if (pAVar9 != (Am_Assoc_Int2Str *)0x0) {
        do {
          pAVar2 = pAVar9->m_next;
          pAVar9->m_next = (Am_Assoc_Int2Str *)0x0;
          uVar3 = (long)pAVar9->m_key % (long)size;
          iVar4 = (int)uVar3;
          uVar6 = (ulong)(uint)-iVar4;
          if (0 < iVar4) {
            uVar6 = uVar3 & 0xffffffff;
          }
          ppAVar5 = this->m_table;
          pAVar9->m_next = ppAVar5[uVar6];
          ppAVar5[uVar6] = pAVar9;
          iVar7 = iVar7 + 1;
          pAVar9 = pAVar2;
        } while (pAVar2 != (Am_Assoc_Int2Str *)0x0);
        this->m_count = iVar7;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar1);
  }
  free(__ptr);
  return;
}

Assistant:

AM_IMPL_MAP(Int2Str, int, 0, const char *, (0L))
#endif

//  This file contains code to time various functions in Amulet. It is used to
//  measure improvements and to make sure new features don't make Amulet
//  slower.

class timing_info
{
public:
  const char *name;
  unsigned long total_time;
  unsigned long cnt;
  float time_each;
};

int my_index = 0;
timing_info all_times[100];

void
print_summary()
{
  std::cout << "\n---------------------\nSummary (DEBUGGING "
#if defined DEBUG | defined _DEBUG
            << "on"
#else
            << "off"
#endif
            << "): \n";

  int i;
  for (i = 0; i < my_index; i++) {
    std::cout << i << ".  " << all_times[i].time_each << " msec per object for "
              << all_times[i].name << std::endl;
  }
  std::cout << std::flush;
}

// Two global Am_Time objects which store the time just before and after
// the test
Am_Time start_time;
Am_Time end_time;

// Get the actual time
void
start_timing()
{
  start_time = Am_Time::Now();
}

void
end_timing(const char *message, long cnt)
{
  // get the actual end time and calc the needed time
  end_time = Am_Time::Now();
  Am_Time total_time = end_time - start_time;

  // get the needed time in milliseconds
  unsigned long total_msec = total_time.Milliseconds();
  float time_each;

  // write the output separated by comma, so that we can read it into excel etc.
  std::cout << my_index << "," << message << "," << total_msec;

  // do we have a cnt value given? This value indicates, that we have
  // tested the timing several times
  if (cnt > 1) {
    // if so, calc the needed time per action and extrapolate it action/s
    time_each = static_cast<float>(total_msec) / static_cast<float>(cnt);

    float persec = 1000.0 / time_each;
    std::cout << "," << cnt << "," << time_each << "," << persec;
  } else {
    time_each = total_msec;
  }

  std::cout << std::endl;

  // save the timing for overall report
  all_times[my_index].name = message;
  all_times[my_index].total_time = total_msec;
  all_times[my_index].cnt = cnt;
  all_times[my_index].time_each = time_each;

  // increment the index
  if (my_index < 100) {
    my_index++;
  } else {
    //		std:cout << "To much tests!" << std::endl;
  }
}

Am_Slot_Key NEW_SLOT = Am_Register_Slot_Name("NEW_SLOT");
Am_Slot_Key MY_LEFT = Am_Register_Slot_Name("MY_LEFT");
Am_Slot_Key NEW_SLOT_INH = Am_Register_Slot_Name("NEW_SLOT_INH");
Am_Slot_Key NEW_SLOT_INH2 = Am_Register_Slot_Name("NEW_SLOT_INH2");
Am_Object win;

Am_Define_Formula(int, int_constraint)
{
  // get a slot-value, convert it to int and add a one
  return (static_cast<int>(self.Get(NEW_SLOT)) + 1);
}